

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBidec.c
# Opt level: O2

void Abc_NtkBidecResyn(Abc_Ntk_t *pNtk,int fVerbose)

{
  Vec_Int_t *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Bdc_Man_t *p;
  void *pvVar5;
  Hop_Obj_t *pObj;
  abctime aVar6;
  uint uVar7;
  Bdc_Par_t local_4c;
  Vec_Int_t *local_40;
  abctime local_38;
  
  local_4c.fVeryVerbose = 0;
  aVar4 = Abc_Clock();
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    iVar1 = Abc_NtkToAig(pNtk);
    if (iVar1 != 0) {
      local_4c.nVarsMax = Abc_NtkGetFaninMax(pNtk);
      local_4c.fVerbose = fVerbose;
      if (0xf < local_4c.nVarsMax) {
        if (fVerbose != 0) {
          puts("Resynthesis is not performed for nodes with more than 15 inputs.");
        }
        local_4c.nVarsMax = 0xf;
      }
      local_38 = aVar4;
      local_40 = (Vec_Int_t *)calloc(1,0x10);
      p = Bdc_ManAlloc(&local_4c);
      uVar7 = 0;
      for (iVar1 = 0; iVar1 < pNtk->vObjs->nSize; iVar1 = iVar1 + 1) {
        pvVar5 = Vec_PtrEntry(pNtk->vObjs,iVar1);
        if (((pvVar5 != (void *)0x0) && ((*(uint *)((long)pvVar5 + 0x14) & 0xf) == 7)) &&
           (*(int *)((long)pvVar5 + 0x1c) < 0x10)) {
          iVar2 = Hop_DagSize(*(Hop_Obj_t **)((long)pvVar5 + 0x38));
          pObj = Abc_NodeIfNodeResyn(p,(Hop_Man_t *)pNtk->pManFunc,
                                     *(Hop_Obj_t **)((long)pvVar5 + 0x38),
                                     *(int *)((long)pvVar5 + 0x1c),local_40,(uint *)0x0,-1.0);
          *(Hop_Obj_t **)((long)pvVar5 + 0x38) = pObj;
          iVar3 = Hop_DagSize(pObj);
          uVar7 = (iVar2 + uVar7) - iVar3;
        }
      }
      Bdc_ManFree(p);
      __ptr = local_40;
      free(local_40->pArray);
      free(__ptr);
      aVar4 = local_38;
      if (fVerbose != 0) {
        iVar1 = 0x79ba17;
        printf("Total gain in AIG nodes = %d.  ",(ulong)uVar7);
        Abc_Print(iVar1,"%s =","Total runtime");
        aVar6 = Abc_Clock();
        Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
      }
    }
    return;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBidec.c"
                ,0x76,"void Abc_NtkBidecResyn(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose )
{
    Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Bdc_Man_t * p;
    Abc_Obj_t * pObj;
    Vec_Int_t * vTruth;
    int i, nGainTotal = 0, nNodes1, nNodes2;
    abctime clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtk) );
    if ( !Abc_NtkToAig(pNtk) )
        return;
    pPars->nVarsMax = Abc_NtkGetFaninMax( pNtk );
    pPars->fVerbose = fVerbose;
    if ( pPars->nVarsMax > 15 )
    {
        if ( fVerbose )
        printf( "Resynthesis is not performed for nodes with more than 15 inputs.\n" );
        pPars->nVarsMax = 15;
    }
    vTruth = Vec_IntAlloc( 0 );
    p = Bdc_ManAlloc( pPars );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) > 15 )
            continue;
        nNodes1 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        pObj->pData = Abc_NodeIfNodeResyn( p, (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, NULL, -1.0 );
        nNodes2 = Hop_DagSize((Hop_Obj_t *)pObj->pData);
        nGainTotal += nNodes1 - nNodes2;
    }
    Bdc_ManFree( p );
    Vec_IntFree( vTruth );
    if ( fVerbose )
    {
    printf( "Total gain in AIG nodes = %d.  ", nGainTotal );
    ABC_PRT( "Total runtime", Abc_Clock() - clk );
    }
}